

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O1

bool mg::data::extract_nxx_header(string_view *in,Nxx *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  
  bVar3 = is_nxx_data(in);
  if (bVar3) {
    uVar1 = *(undefined8 *)in->_M_str;
    uVar2 = *(undefined8 *)(in->_M_str + 8);
    out->magic[0] = (char)uVar1;
    out->magic[1] = (char)((ulong)uVar1 >> 8);
    out->magic[2] = (char)((ulong)uVar1 >> 0x10);
    out->magic[3] = (char)((ulong)uVar1 >> 0x18);
    out->size = (int)((ulong)uVar1 >> 0x20);
    out->compressed_size = (int)uVar2;
    out->_padding = (int)((ulong)uVar2 >> 0x20);
  }
  return bVar3;
}

Assistant:

bool extract_nxx_header(const std::string_view &in, Nxx &out) {
  // Does this look like nxx?
  if (!is_nxx_data(in)) {
    return false;
  }

  // Pun header
  out = *reinterpret_cast<const Nxx *>(in.data());
  out.to_host_order();
  return true;
}